

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O3

_Bool place_monster_base_okay(monster_race *race)

{
  _Bool _Var1;
  bool bVar2;
  
  if (place_monster_base == (monster_base *)0x0) {
    __assert_fail("place_monster_base",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                  ,0x801,"_Bool place_monster_base_okay(struct monster_race *)");
  }
  if (race != (monster_race *)0x0) {
    if (race->base == place_monster_base) {
      _Var1 = flag_has_dbg(race->flags,0xc,1,"race->flags","RF_UNIQUE");
      bVar2 = !_Var1;
    }
    else {
      bVar2 = false;
    }
    return bVar2;
  }
  __assert_fail("race",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                ,0x802,"_Bool place_monster_base_okay(struct monster_race *)");
}

Assistant:

static bool place_monster_base_okay(struct monster_race *race)
{
	assert(place_monster_base);
	assert(race);

	/* Check if it matches */
	if (race->base != place_monster_base) return false;

	/* No uniques */
	if (rf_has(race->flags, RF_UNIQUE)) return false;

	return true;
}